

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_decompress.cpp
# Opt level: O2

int main(void)

{
  buffer_t compressed;
  buffer_t decompressed;
  string_t local_48;
  string input;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&input,
             "this is a string that I want to compress into a smaller\nstring. Just to make sure there is enough data in the\ncompression buffer, I\'m going to fill this string with a\ndecent amount of content. Let\'s hope this works.\n"
             ,(allocator<char> *)&compressed);
  std::__cxx11::string::string((string *)&local_48,&input);
  zstdpp::compress(&compressed,&local_48,'\x16');
  std::__cxx11::string::~string((string *)&local_48);
  zstdpp::decompress(&decompressed,&compressed);
  print_decompress_result(&compressed,&decompressed);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&decompressed.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&compressed.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::__cxx11::string::~string((string *)&input);
  return 0;
}

Assistant:

int main() {
  std::string input("this is a string that I want to compress into a smaller\n"
                    "string. Just to make sure there is enough data in the\n"
                    "compression buffer, I'm going to fill this string with a\n"
                    "decent amount of content. Let's hope this works.\n");

  auto compressed = zstdpp::compress(input, 22);
  auto decompressed = zstdpp::decompress(compressed);

  print_decompress_result(compressed, decompressed);
  
}